

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void parse_chunk(LexState *ls)

{
  uint8_t *puVar1;
  long lVar2;
  BCLine line;
  GCtab *pGVar3;
  bool bVar4;
  byte bVar5;
  LexToken LVar6;
  BCPos BVar7;
  BCPos pc;
  BCPos list;
  BCPos BVar8;
  int iVar9;
  int iVar10;
  BCReg BVar11;
  uint uVar12;
  VarInfo *pVVar13;
  GCstr *pGVar14;
  BCInsLine *pBVar15;
  cTValue *pcVar16;
  BCReg BVar17;
  uint uVar18;
  BCIns ins;
  char *__s2;
  ulong uVar19;
  FuncState *pFVar20;
  ExpDesc e;
  anon_union_8_3_2ce71dea_for_u local_70;
  ExpKind local_68;
  undefined1 local_64;
  byte local_63;
  BCLine local_54;
  FuncScope local_50;
  ulong local_40;
  FuncState *local_38;
  
  synlevel_begin(ls);
  bVar4 = false;
LAB_001228b3:
  if (bVar4) {
LAB_001234be:
    ls->level = ls->level - 1;
    return;
  }
  iVar9 = ls->tok;
  if ((iVar9 - 0x104U < 0x1e) && ((0x20020007U >> (iVar9 - 0x104U & 0x1f) & 1) != 0))
  goto LAB_001234be;
  if (0x14 < iVar9 - 0x102U) {
    if (iVar9 != 0x11d) goto switchD_001228f4_caseD_104;
    parse_label(ls);
    goto LAB_0012313b;
  }
  line = ls->linenumber;
  switch(iVar9) {
  case 0x102:
    lj_lex_next(ls);
    parse_break(ls);
    goto LAB_00122e5a;
  case 0x103:
    lj_lex_next(ls);
    parse_block(ls);
    lex_match(ls,0x106,0x103,line);
    break;
  default:
    goto switchD_001228f4_caseD_104;
  case 0x108:
    local_38 = ls->fs;
    local_50.nactvar = (uint8_t)local_38->nactvar;
    local_50.flags = '\x01';
    local_50.vstart = local_38->ls->vtop;
    local_50.prev = local_38->bl;
    local_38->bl = &local_50;
    lj_lex_next(ls);
    pGVar14 = lex_str(ls);
    iVar9 = ls->tok;
    if ((iVar9 == 0x2c) || (iVar9 == 0x10c)) {
      pFVar20 = ls->fs;
      uVar12 = pFVar20->pc;
      local_40 = (ulong)pFVar20->freereg;
      var_new(ls,0,(GCstr *)0x4);
      var_new(ls,1,(GCstr *)0x5);
      var_new(ls,2,(GCstr *)0x6);
      var_new(ls,3,pGVar14);
      iVar9 = 0x2000000;
      BVar11 = 4;
      while (iVar10 = lex_opt(ls,0x2c), iVar10 != 0) {
        pGVar14 = lex_str(ls);
        var_new(ls,BVar11,pGVar14);
        iVar9 = iVar9 + 0x1000000;
        BVar11 = BVar11 + 1;
      }
      lex_check(ls,0x10c);
      local_54 = ls->linenumber;
      BVar17 = expr_list(ls,&e);
      assign_adjust(ls,3,BVar17,&e);
      bcreg_bump(pFVar20,3);
      if ((BVar11 < 6) && (uVar12 < pFVar20->pc)) {
        uVar18 = pFVar20->bcbase[uVar12].ins;
        if ((char)uVar18 == '6') {
          pGVar3 = pFVar20->kt;
          pGVar14 = lj_str_new(ls->L,"pairs",5);
          pcVar16 = lj_tab_getstr(pGVar3,pGVar14);
          if (((pcVar16 == (cTValue *)0x0) || ((pcVar16->field_2).it != 0)) ||
             (uVar12 = 1, (pcVar16->u32).lo != uVar18 >> 0x10)) {
            pGVar3 = pFVar20->kt;
            pGVar14 = lj_str_new(ls->L,"next",4);
            pcVar16 = lj_tab_getstr(pGVar3,pGVar14);
            if (((pcVar16 == (cTValue *)0x0) || ((pcVar16->field_2).it != 0)) ||
               (uVar12 = 1, (pcVar16->u32).lo != uVar18 >> 0x10)) goto LAB_0012330c;
          }
        }
        else if ((uVar18 & 0xff) == 0x2d) {
          lVar2 = (ulong)(uVar18 >> 0x10) * 2 + 0x1ec;
LAB_00123262:
          uVar19 = (ulong)ls->vstack[*(ushort *)((long)pFVar20->varmap + lVar2 + -0x5c)].name.
                          gcptr32;
          iVar10 = *(int *)(uVar19 + 0xc);
          if (iVar10 == 4) {
            __s2 = "next";
          }
          else {
            if (iVar10 != 5) goto LAB_0012330c;
            __s2 = "pairs";
          }
          iVar10 = strcmp((char *)(uVar19 + 0x10),__s2);
          uVar12 = (uint)(iVar10 == 0);
        }
        else {
          if (((uVar18 & 0xff) == 0x12) && (uVar18 >> 0x10 < pFVar20->nactvar)) {
            lVar2 = (ulong)(uVar18 >> 0x10) * 2 + 0x5c;
            goto LAB_00123262;
          }
LAB_0012330c:
          uVar12 = 0;
        }
      }
      else {
        uVar12 = 0;
      }
      var_add(ls,3);
      lex_check(ls,0x103);
      iVar10 = (int)local_40 * 0x100;
      uVar18 = iVar10 + 0x300;
      BVar8 = bcemit_INS(pFVar20,((byte)~(byte)uVar12 & 1) * 0x10 + iVar10 + 0x300 | 0x7fff0048);
      local_64 = (undefined1)pFVar20->nactvar;
      local_63 = 0;
      local_68 = pFVar20->ls->vtop;
      local_70 = (anon_union_8_3_2ce71dea_for_u)pFVar20->bl;
      pFVar20->bl = (FuncScope *)&local_70;
      var_add(ls,BVar11 - 3);
      bcreg_reserve(pFVar20,BVar11 - 3);
      parse_block(ls);
      fscope_end(pFVar20);
      jmp_patchins(pFVar20,BVar8,pFVar20->pc);
      bcemit_INS(pFVar20,uVar12 + iVar9 + 0x45 | uVar18 | 0x30000);
      BVar7 = bcemit_INS(pFVar20,uVar18 | 0x7fff0052);
      pBVar15 = pFVar20->bcbase;
      pBVar15[BVar7 - 1].line = local_54;
      pBVar15[BVar7].line = local_54;
      jmp_patchins(pFVar20,BVar7,BVar8 + 1);
    }
    else {
      if (iVar9 != 0x3d) {
        err_syntax(ls,LJ_ERR_XFOR);
      }
      pFVar20 = ls->fs;
      BVar11 = pFVar20->freereg;
      var_new(ls,0,(GCstr *)0x1);
      var_new(ls,1,(GCstr *)0x2);
      var_new(ls,2,(GCstr *)0x3);
      var_new(ls,3,pGVar14);
      lex_check(ls,0x3d);
      expr_next(ls);
      lex_check(ls,0x2c);
      expr_next(ls);
      iVar9 = lex_opt(ls,0x2c);
      if (iVar9 == 0) {
        bcemit_INS(pFVar20,pFVar20->freereg << 8 | 0x10029);
        bcreg_reserve(pFVar20,1);
      }
      else {
        expr_next(ls);
      }
      var_add(ls,3);
      lex_check(ls,0x103);
      uVar12 = BVar11 << 8;
      BVar8 = bcemit_INS(pFVar20,uVar12 | 0x7fff004d);
      e.t._0_1_ = (undefined1)pFVar20->nactvar;
      e.t._1_1_ = 0;
      e.k = pFVar20->ls->vtop;
      e.u = (anon_union_8_3_2ce71dea_for_u)pFVar20->bl;
      pFVar20->bl = (FuncScope *)&e;
      var_add(ls,1);
      bcreg_reserve(pFVar20,1);
      parse_block(ls);
      fscope_end(pFVar20);
      BVar7 = bcemit_INS(pFVar20,uVar12 | 0x7fff004f);
      pFVar20->bcbase[BVar7].line = line;
      jmp_patchins(pFVar20,BVar7,BVar8 + 1);
      jmp_patchins(pFVar20,BVar8,pFVar20->pc);
    }
    lex_match(ls,0x106,0x108,line);
    pFVar20 = local_38;
    goto LAB_0012349a;
  case 0x109:
    lj_lex_next(ls);
    pFVar20 = ls->fs;
    pGVar14 = lex_str(ls);
    var_lookup_(pFVar20,pGVar14,&e,1);
    while (iVar9 = ls->tok, iVar9 == 0x2e) {
      expr_field(ls,&e);
    }
    if (iVar9 == 0x3a) {
      expr_field(ls,&e);
    }
    parse_body(ls,(ExpDesc *)&local_70.s,(uint)(iVar9 == 0x3a),line);
    pFVar20 = ls->fs;
    bcemit_store(pFVar20,&e,(ExpDesc *)&local_70.s);
    pFVar20->bcbase[pFVar20->pc - 1].line = line;
    bVar4 = false;
    goto LAB_001234a5;
  case 0x10a:
    LVar6 = lj_lex_lookahead(ls);
    if (LVar6 == 0x11f) {
      lj_lex_next(ls);
      pFVar20 = ls->fs;
      pGVar14 = lex_str(ls);
      pVVar13 = gola_findlabel(ls,pGVar14);
      if (pVVar13 != (VarInfo *)0x0) {
        bcemit_INS(pFVar20,(uint)pVVar13->slot << 8 | 0x7fff0055);
      }
      puVar1 = &pFVar20->bl->flags;
      *puVar1 = *puVar1 | 4;
      BVar8 = bcemit_jmp(pFVar20);
      gola_new(ls,pGVar14,'\x02',BVar8);
      goto LAB_0012349f;
    }
    goto switchD_001228f4_caseD_104;
  case 0x10b:
    pFVar20 = ls->fs;
    e.u.s.info = 0xffffffff;
    while( true ) {
      lj_lex_next(ls);
      BVar8 = expr_cond(ls);
      lex_check(ls,0x113);
      parse_block(ls);
      if (ls->tok != 0x105) break;
      BVar7 = bcemit_jmp(pFVar20);
      jmp_append(pFVar20,(BCPos *)&e,BVar7);
      jmp_tohere(pFVar20,BVar8);
    }
    if (ls->tok == 0x104) {
      BVar7 = bcemit_jmp(pFVar20);
      jmp_append(pFVar20,(BCPos *)&e,BVar7);
      jmp_tohere(pFVar20,BVar8);
      lj_lex_next(ls);
      parse_block(ls);
    }
    else {
      jmp_append(pFVar20,(BCPos *)&e,BVar8);
    }
    jmp_tohere(pFVar20,e.u.s.info);
    lex_match(ls,0x106,0x10b,line);
    goto LAB_0012349f;
  case 0x10d:
    lj_lex_next(ls);
    iVar9 = lex_opt(ls,0x109);
    if (iVar9 == 0) {
      BVar11 = 0;
      do {
        BVar17 = BVar11 + 1;
        pGVar14 = lex_str(ls);
        var_new(ls,BVar11,pGVar14);
        iVar9 = lex_opt(ls,0x2c);
        BVar11 = BVar17;
      } while (iVar9 != 0);
      iVar9 = lex_opt(ls,0x3d);
      if (iVar9 == 0) {
        e.k = VVOID;
        BVar11 = 0;
      }
      else {
        BVar11 = expr_list(ls,&e);
      }
      assign_adjust(ls,BVar17,BVar11,&e);
      var_add(ls,BVar17);
    }
    else {
      pFVar20 = ls->fs;
      pGVar14 = lex_str(ls);
      var_new(ls,0,pGVar14);
      BVar11 = pFVar20->freereg;
      bcreg_reserve(pFVar20,1);
      var_add(ls,1);
      parse_body(ls,&e,0,ls->linenumber);
      if ((e.k == VNONRELOC) && (pFVar20->nactvar <= e.u.s.info)) {
        pFVar20->freereg = pFVar20->freereg - 1;
      }
      expr_toreg(pFVar20,&e,BVar11);
      ls->vstack[pFVar20->varmap[pFVar20->nactvar - 1]].startpc = pFVar20->pc;
    }
    break;
  case 0x111:
    pFVar20 = ls->fs;
    BVar8 = pFVar20->pc;
    pFVar20->lasttarget = BVar8;
    e.t._0_1_ = (undefined1)pFVar20->nactvar;
    e.t._1_1_ = 1;
    e.k = pFVar20->ls->vtop;
    e.u = (anon_union_8_3_2ce71dea_for_u)pFVar20->bl;
    local_63 = 0;
    local_70.sval = (GCstr *)&e;
    pFVar20->bl = (FuncScope *)&local_70;
    local_68 = e.k;
    local_64 = (undefined1)e.t;
    lj_lex_next(ls);
    bcemit_INS(pFVar20,pFVar20->nactvar << 8 | 0x55);
    parse_chunk(ls);
    lex_match(ls,0x115,0x111,line);
    BVar7 = expr_cond(ls);
    if ((local_63 & 8) == 0) {
      fscope_end(pFVar20);
    }
    else {
      parse_break(ls);
      jmp_tohere(pFVar20,BVar7);
      fscope_end(pFVar20);
      BVar7 = bcemit_jmp(pFVar20);
    }
    jmp_patch(pFVar20,BVar7,BVar8);
    jmp_patchins(pFVar20,BVar8,pFVar20->pc);
LAB_0012349a:
    fscope_end(pFVar20);
LAB_0012349f:
    bVar4 = false;
    goto LAB_001234a5;
  case 0x112:
    pFVar20 = ls->fs;
    lj_lex_next(ls);
    bVar5 = pFVar20->flags | 0x20;
    pFVar20->flags = bVar5;
    ins = 0x1004b;
    uVar12 = ls->tok - 0x104;
    if (((0x1d < uVar12) || ((0x20020007U >> (uVar12 & 0x1f) & 1) == 0)) && (ls->tok != 0x3b)) {
      BVar11 = expr_list(ls,&e);
      if (BVar11 == 1) {
        if (e.k == VCALL) {
          pBVar15 = pFVar20->bcbase;
          if ((char)pBVar15[(ulong)e.u.sval & 0xffffffff].ins == 'G') goto LAB_00123234;
          pFVar20->pc = pFVar20->pc - 1;
          uVar12 = (pBVar15[(ulong)e.u.sval & 0xffffffff].ins & 0xff) + 2;
          uVar18 = pBVar15[(ulong)e.u.sval & 0xffffffff].ins & 0xffff00;
LAB_00123347:
          ins = uVar18 | uVar12;
        }
        else {
          BVar11 = expr_toanyreg(pFVar20,&e);
          ins = BVar11 << 8 | 0x2004c;
        }
      }
      else {
        if (e.k != VCALL) {
          expr_tonextreg(pFVar20,&e);
          uVar12 = pFVar20->nactvar << 8;
          uVar18 = BVar11 * 0x10000 + 0x1004a;
          goto LAB_00123347;
        }
        pBVar15 = pFVar20->bcbase;
LAB_00123234:
        *(undefined1 *)((long)&pBVar15[(ulong)e.u.sval & 0xffffffff].ins + 3) = 0;
        ins = (e.u.s.aux - pFVar20->nactvar) * 0x10000 | pFVar20->nactvar << 8 | 0x49;
      }
      bVar5 = pFVar20->flags;
    }
    if ((bVar5 & 1) != 0) {
      bcemit_INS(pFVar20,0x80000032);
    }
    bcemit_INS(pFVar20,ins);
LAB_00122e5a:
    bVar4 = true;
    goto LAB_001234a5;
  case 0x116:
    pFVar20 = ls->fs;
    lj_lex_next(ls);
    BVar8 = pFVar20->pc;
    pFVar20->lasttarget = BVar8;
    BVar7 = expr_cond(ls);
    e.t._0_1_ = (undefined1)pFVar20->nactvar;
    e.t._1_1_ = 1;
    e.k = pFVar20->ls->vtop;
    e.u = (anon_union_8_3_2ce71dea_for_u)pFVar20->bl;
    pFVar20->bl = (FuncScope *)&e;
    lex_check(ls,0x103);
    pc = bcemit_INS(pFVar20,pFVar20->nactvar << 8 | 0x55);
    parse_block(ls);
    list = bcemit_jmp(pFVar20);
    jmp_patch(pFVar20,list,BVar8);
    lex_match(ls,0x106,0x116,line);
    fscope_end(pFVar20);
    jmp_tohere(pFVar20,BVar7);
    jmp_patchins(pFVar20,pc,pFVar20->pc);
  }
LAB_0012313b:
  bVar4 = false;
LAB_001234a5:
  lex_opt(ls,0x3b);
  ls->fs->freereg = ls->fs->nactvar;
  goto LAB_001228b3;
switchD_001228f4_caseD_104:
  pFVar20 = ls->fs;
  expr_primary(ls,&e);
  if (e.k == VCALL) {
    *(undefined1 *)((long)&pFVar20->bcbase[(ulong)e.u.sval & 0xffffffff].ins + 3) = 1;
  }
  else {
    parse_assignment(ls,(LHSVarList *)&e,1);
  }
  goto LAB_0012313b;
}

Assistant:

static void parse_chunk(LexState *ls)
{
  int islast = 0;
  synlevel_begin(ls);
  while (!islast && !parse_isend(ls->tok)) {
    islast = parse_stmt(ls);
    lex_opt(ls, ';');
    lj_assertLS(ls->fs->framesize >= ls->fs->freereg &&
		ls->fs->freereg >= ls->fs->nactvar,
		"bad regalloc");
    ls->fs->freereg = ls->fs->nactvar;  /* Free registers after each stmt. */
  }
  synlevel_end(ls);
}